

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O3

bool __thiscall
Rml::ElementAnimation::InternalAddKey
          (ElementAnimation *this,float time,Property *in_property,Element *element,Tween tween)

{
  Unit UVar1;
  Type TVar2;
  Type TVar3;
  pointer pAVar4;
  TransformPrimitive *pTVar5;
  Transform *t;
  pointer pTVar6;
  code *pcVar7;
  Transform *this_00;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  pointer pTVar13;
  Transform *pTVar14;
  pointer puVar15;
  long lVar16;
  char *pcVar17;
  byte bVar18;
  long lVar19;
  pointer pTVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  Type *pTVar21;
  ulong uVar22;
  TransformPrimitive *pTVar23;
  _Bit_type *p_Var24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  Vector<AnimationKey> *pVVar29;
  TransformPrimitive *primitive;
  pointer pAVar30;
  Property *this_01;
  int iVar31;
  PrimitiveList *__range2;
  Transform *pTVar32;
  long lVar33;
  ulong uVar34;
  byte bVar35;
  Vector<size_t> matching_indices;
  size_t i_big;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  unsigned_long local_120;
  Property *local_118;
  Vector<AnimationKey> *local_110;
  int local_104;
  int local_100;
  float local_fc;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [3];
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong *local_80;
  ulong local_78;
  ulong *local_70;
  vector<bool,_std::allocator<bool>_> local_68;
  Tween local_40;
  
  local_40.callback = tween.callback;
  local_40._0_8_ = tween._0_8_;
  bVar35 = 0;
  local_fc = time;
  if ((in_property->unit & (FILTER|DECORATOR|TRANSFORM|ANGLE|NUMBER_LENGTH_PERCENT|COLOUR|KEYWORD))
      == UNKNOWN) {
    pcVar17 = "Property value does not";
    if (in_property->unit == BOXSHADOWLIST) {
      pcVar17 = "Box shadows do not";
    }
    Property::ToString_abi_cxx11_((String *)local_f8,in_property);
    Log::Message(LT_WARNING,"%s support animations or transitions. Value: %s",pcVar17,local_f8._0_8_
                );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8[0]._M_allocated_capacity + 1);
    }
LAB_00221238:
    bVar8 = false;
  }
  else {
    pVVar29 = &this->keys;
    ::std::vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>>::
    emplace_back<float&,Rml::Property_const&,Rml::Tween&>
              ((vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>> *)pVVar29,&local_fc,
               in_property,&local_40);
    pAVar4 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    UVar1 = pAVar4[-1].property.unit;
    bVar8 = true;
    if (UVar1 == FILTER) {
      if ((pAVar4[-1].property.value.type != FILTERSPTR) &&
         (bVar10 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::FILTERSPTR)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                          ,0x27f), !bVar10)) {
LAB_0022124e:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      if (*(long *)pAVar4[-1].property.value.data != 0) {
        return true;
      }
      local_f8._8_8_ = operator_new(0x48);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0032f780;
      local_f8._0_8_ = local_f8._8_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x40))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      *(_Atomic_word **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_use_count =
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_use_count;
      Variant::operator=(&pAVar4[-1].property.value,
                         (shared_ptr<Rml::FilterDeclarationList> *)local_f8);
    }
    else {
      if (UVar1 != DECORATOR) {
        if (UVar1 != TRANSFORM) {
          return true;
        }
        pAVar30 = (pVVar29->
                  super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        iVar11 = (int)((ulong)((long)pAVar4 - (long)pAVar30) >> 3) * -0x3b13b13b;
        uVar12 = iVar11 - 1;
        uVar28 = (ulong)uVar12;
        lVar19 = (long)(int)uVar12;
        bVar18 = 1;
        local_118 = in_property;
        local_110 = pVVar29;
        do {
          if ((pAVar30[lVar19].property.value.type != TRANSFORMPTR) &&
             (bVar8 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::TRANSFORMPTR)",
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                             ,0x227), !bVar8)) goto LAB_0022124e;
          pTVar32 = *(Transform **)pAVar30[lVar19].property.value.data;
          if (pTVar32 == (Transform *)0x0) {
            local_f8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<Rml::Transform,std::allocator<Rml::Transform>>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8 + 8),
                       (Transform **)local_f8,(allocator<Rml::Transform> *)&local_68);
            Variant::Clear(&pAVar30[lVar19].property.value);
            Variant::Set(&pAVar30[lVar19].property.value,(TransformPtr *)local_f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
            }
            pTVar32 = *(Transform **)pAVar30[lVar19].property.value.data;
          }
          pTVar5 = (pTVar32->primitives).
                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pTVar23 = (pTVar32->primitives).
                         super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_start; pTVar23 != pTVar5;
              pTVar23 = pTVar23 + 1) {
            bVar8 = TransformUtilities::PrepareForInterpolation(pTVar23,element);
            if (!bVar8) {
              bVar8 = CombineAndDecompose(pTVar32,element);
              bVar18 = bVar18 & bVar8;
              break;
            }
          }
          pVVar29 = local_110;
          this_01 = local_118;
          lVar19 = lVar19 + 1;
          pAVar30 = (this->keys).
                    super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar33 = (long)(this->keys).
                         super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pAVar30 >> 3;
          uVar34 = lVar33 * 0x4ec4ec4ec4ec4ec5;
          iVar31 = (int)uVar34;
        } while (lVar19 < iVar31);
        if (bVar18 != 0) {
          if (iVar11 < 2) {
            return true;
          }
          if (uVar34 < 2) {
            return true;
          }
          local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
          ::std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_68,(long)((uVar34 << 0x20) + 0x100000000) >> 0x20,(bool *)local_f8,
                     (allocator_type *)&local_138);
          local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] =
               local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] | 1L << ((byte)uVar12 & 0x3f);
          bVar8 = -1 < iVar31;
          if (iVar11 <= iVar31) {
            iVar11 = (int)lVar33 * 0x4ec4ec4f;
            iVar25 = -1;
            p_Var24 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            local_104 = iVar11;
LAB_00220acb:
            bVar18 = 0;
            bVar10 = true;
            uVar26 = 1L << ((byte)uVar28 & 0x3f);
            uVar34 = uVar28 >> 6;
            if ((p_Var24[uVar34] >> (uVar28 & 0x3f) & 1) == 0) {
              uVar28 = (ulong)((int)uVar28 + 1);
              goto LAB_00220ff7;
            }
            uVar22 = (ulong)((int)uVar28 - 1);
            pAVar4 = (pVVar29->
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            bVar8 = false;
            local_90 = uVar34;
            local_88 = uVar26;
            if ((pAVar4[uVar22].property.unit != TRANSFORM) ||
               (local_98 = uVar28, pAVar4[uVar28].property.unit != TRANSFORM)) goto LAB_002211ce;
            pTVar32 = *(Transform **)((long)&pAVar4[uVar22].property.value + 8);
            t = *(Transform **)((long)&pAVar4[uVar28].property.value + 8);
            pTVar13 = (pTVar32->primitives).
                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pTVar6 = (pTVar32->primitives).
                     super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            lVar19 = (long)pTVar6 - (long)pTVar13;
            pTVar20 = (t->primitives).
                      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar33 = (long)(t->primitives).
                           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar20;
            local_100 = iVar25;
            local_a0 = uVar22;
            if (lVar19 == lVar33) {
              if (pTVar6 == pTVar13) {
                bVar18 = 0;
                bVar10 = false;
              }
              else {
                lVar19 = 0;
                bVar18 = 0;
                bVar10 = false;
                uVar28 = 0;
                do {
                  iVar11 = *(int *)((long)&pTVar13->type + lVar19);
                  iVar25 = *(int *)((long)&pTVar20->type + lVar19);
                  bVar8 = TransformUtilities::TryConvertToMatchingGenericType
                                    ((TransformPrimitive *)((long)&pTVar13->type + lVar19),
                                     (TransformPrimitive *)((long)&pTVar20->type + lVar19));
                  if (!bVar8) {
                    lVar19 = (long)(pTVar32->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar32->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    lVar33 = (long)(t->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(t->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                    goto LAB_00220c18;
                  }
                  pTVar13 = (pTVar32->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  bVar10 = (bool)(bVar10 | *(int *)((long)&pTVar13->type + lVar19) != iVar11);
                  pTVar20 = (t->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (*(int *)((long)&pTVar20->type + lVar19) != iVar25) {
                    bVar18 = 2;
                  }
                  uVar28 = uVar28 + 1;
                  lVar19 = lVar19 + 0x48;
                } while (uVar28 < (ulong)(((long)(pTVar32->primitives).
                                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pTVar13 >> 3) * -0x71c71c71c71c71c7));
              }
            }
            else {
LAB_00220c18:
              uVar28 = (lVar19 >> 3) * -0x71c71c71c71c71c7;
              uVar34 = (lVar33 >> 3) * -0x71c71c71c71c71c7;
              if (uVar28 + (lVar33 >> 3) * 0x71c71c71c71c71c7 != 0) {
                pTVar14 = pTVar32;
                this_00 = t;
                if (uVar28 < uVar34) {
                  pTVar14 = t;
                  this_00 = pTVar32;
                }
                local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start = (ulong *)0x0;
                local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish = (ulong *)0x0;
                local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
                local_b0 = uVar34;
                local_a8 = uVar28;
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                          (&local_138,
                           ((long)(this_00->primitives).
                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->primitives).
                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x71c71c71c71c71c7 + 1);
                local_120 = 0;
                if ((this_00->primitives).
                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    (this_00->primitives).
                    super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  bVar8 = false;
                }
                else {
                  uVar28 = 0;
                  bVar8 = false;
                  do {
                    pTVar13 = (pTVar14->primitives).
                              super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar19 = (long)(pTVar14->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13;
                    while( true ) {
                      if ((ulong)((lVar19 >> 3) * -0x71c71c71c71c71c7) <= local_120) {
                        bVar8 = true;
                        goto LAB_00220eef;
                      }
                      TVar2 = pTVar13[local_120].type;
                      bVar9 = TransformUtilities::TryConvertToMatchingGenericType
                                        ((this_00->primitives).
                                         super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar28,
                                         pTVar13 + local_120);
                      if (bVar9) break;
                      local_120 = local_120 + 1;
                      pTVar13 = (pTVar14->primitives).
                                super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar19 = (long)(pTVar14->primitives).
                                     super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13;
                    }
                    TVar3 = (pTVar14->primitives).
                            super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_120].type;
                    if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
                      _M_realloc_insert<unsigned_long_const&>
                                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_138,
                                 (iterator)
                                 local_138.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_120);
                    }
                    else {
                      *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_120;
                      local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_138.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    bVar8 = (bool)(bVar8 | TVar3 != TVar2);
                    local_120 = local_120 + 1;
                    uVar28 = uVar28 + 1;
                  } while (uVar28 < (ulong)(((long)(this_00->primitives).
                                                                                                      
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this_00->primitives).
                                                                                                      
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                           -0x71c71c71c71c71c7));
                }
                __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(((long)(pTVar14->primitives).
                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar14->primitives).
                                 super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x71c71c71c71c71c7);
                local_f8._0_8_ = __n;
                if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_138,
                             (iterator)
                             local_138.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)local_f8);
                  __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(((long)(pTVar14->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar14->primitives).
                                   super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x71c71c71c71c71c7);
                }
                else {
                  *local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)__n;
                  local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                ::std::vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::
                reserve(&this_00->primitives,(size_type)__n);
                local_80 = local_138.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish;
                if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  uVar28 = 0;
                  puVar15 = local_138.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    local_78 = *puVar15;
                    lVar19 = local_78 - uVar28;
                    local_70 = puVar15;
                    if (uVar28 <= local_78 && lVar19 != 0) {
                      lVar33 = uVar28 * 0x48;
                      do {
                        pTVar21 = (Type *)((long)&((pTVar14->primitives).
                                                                                                      
                                                  super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                          lVar33);
                        pTVar23 = (TransformPrimitive *)local_f8;
                        for (lVar16 = 0x12; lVar16 != 0; lVar16 = lVar16 + -1) {
                          pTVar23->type = *pTVar21;
                          pTVar21 = pTVar21 + (ulong)bVar35 * -2 + 1;
                          pTVar23 = (TransformPrimitive *)((long)pTVar23 + (ulong)bVar35 * -8 + 4);
                        }
                        TransformUtilities::SetIdentity((TransformPrimitive *)local_f8);
                        ::std::
                        vector<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>::
                        insert(&this_00->primitives,
                               (TransformPrimitive *)
                               ((long)&((this_00->primitives).
                                        super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->type + lVar33),
                               (TransformPrimitive *)local_f8);
                        lVar33 = lVar33 + 0x48;
                        lVar19 = lVar19 + -1;
                      } while (lVar19 != 0);
                    }
                    uVar28 = local_78 + 1;
                    puVar15 = local_70 + 1;
                  } while (puVar15 != local_80);
                }
                bVar18 = 2 - (local_a8 < local_b0);
                if (bVar8) {
                  bVar18 = 3;
                }
                bVar10 = bVar8 || local_a8 < local_b0;
                bVar8 = false;
LAB_00220eef:
                if (local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start != (ulong *)0x0) {
                  operator_delete(local_138.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_138.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_138.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (!bVar8) goto LAB_00220f46;
              }
              bVar8 = CombineAndDecompose(pTVar32,element);
              if (!bVar8) {
                bVar8 = false;
                pVVar29 = local_110;
                this_01 = local_118;
LAB_002211ce:
                if (local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
                    (_Bit_type *)0x0) goto LAB_002211db;
                goto LAB_002211eb;
              }
              bVar8 = CombineAndDecompose(t,element);
              bVar18 = 3;
              bVar10 = true;
              if (!bVar8) {
                bVar8 = false;
                pVVar29 = local_110;
                this_01 = local_118;
                goto LAB_002211ce;
              }
            }
LAB_00220f46:
            local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_90] =
                 local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[local_90] &
                 ~local_88;
            uVar26 = local_a0 >> 6 & 0x3ffffff;
            uVar28 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar26];
            uVar22 = uVar28 | 1L << (local_a0 & 0x3f);
            uVar34 = uVar28 & ~(1L << (local_a0 & 0x3f));
            if ((uVar28 >> (local_a0 & 0x3f) & 1) != 0) {
              uVar34 = uVar22;
            }
            uVar12 = (int)local_98 + 1;
            uVar27 = (ulong)uVar12;
            if (bVar10) {
              uVar34 = uVar22;
            }
            local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar26] = uVar34;
            uVar28 = (ulong)uVar12;
            if (bVar10) {
              uVar28 = local_a0 & 0xffffffff;
            }
            uVar34 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6];
            uVar22 = uVar34 | 1L << (uVar27 & 0x3f);
            uVar26 = uVar34 & ~(1L << (uVar27 & 0x3f));
            if ((uVar34 >> (uVar27 & 0x3f) & 1) != 0) {
              uVar26 = uVar22;
            }
            if ((bVar18 & 2) != 0) {
              uVar26 = uVar22;
            }
            local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar12 >> 6] = uVar26;
            p_Var24 = local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            pVVar29 = local_110;
            this_01 = local_118;
            iVar11 = local_104;
            iVar25 = local_100;
            if ((int)local_98 < 2) {
              uVar28 = uVar27;
            }
LAB_00220ff7:
            iVar25 = iVar25 + 1;
            bVar8 = iVar25 < iVar11;
            if ((iVar31 <= (int)uVar28) || (iVar11 <= iVar25)) goto LAB_002211ce;
            goto LAB_00220acb;
          }
LAB_002211db:
          operator_delete(local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_68.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
LAB_002211eb:
          if (bVar8) {
            return true;
          }
        }
        Property::ToString_abi_cxx11_((String *)local_f8,this_01);
        Log::Message(LT_WARNING,"Could not add animation key with property \'%s\'.",local_f8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._0_8_ != local_e8) {
          operator_delete((void *)local_f8._0_8_,local_e8[0]._M_allocated_capacity + 1);
        }
        ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::pop_back(pVVar29);
        goto LAB_00221238;
      }
      if ((pAVar4[-1].property.value.type != DECORATORSPTR) &&
         (bVar10 = Assert("RMLUI_ASSERT(property.value.GetType() == Variant::DECORATORSPTR)",
                          "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                          ,0x277), !bVar10)) goto LAB_0022124e;
      if (*(long *)pAVar4[-1].property.value.data != 0) {
        return true;
      }
      local_f8._8_8_ = operator_new(0x48);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_0032f730;
      local_f8._0_8_ = local_f8._8_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x10))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_weak_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x40))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      *(_Atomic_word **)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x20))->_M_use_count =
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_f8._8_8_ + 0x30))->_M_use_count;
      Variant::operator=(&pAVar4[-1].property.value,
                         (shared_ptr<Rml::DecoratorDeclarationList> *)local_f8);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
    }
  }
  return bVar8;
}

Assistant:

bool ElementAnimation::InternalAddKey(float time, const Property& in_property, Element& element, Tween tween)
{
	const Units valid_units =
		(Unit::NUMBER_LENGTH_PERCENT | Unit::ANGLE | Unit::COLOUR | Unit::TRANSFORM | Unit::KEYWORD | Unit::DECORATOR | Unit::FILTER);

	if (!Any(in_property.unit & valid_units))
	{
		const char* property_type = (in_property.unit == Unit::BOXSHADOWLIST ? "Box shadows do not" : "Property value does not");
		Log::Message(Log::LT_WARNING, "%s support animations or transitions. Value: %s", property_type, in_property.ToString().c_str());
		return false;
	}

	keys.emplace_back(time, in_property, tween);
	Property& property = keys.back().property;
	bool result = true;

	if (property.unit == Unit::TRANSFORM)
	{
		result = PrepareTransforms(keys, element, (int)keys.size() - 1);
	}
	else if (property.unit == Unit::DECORATOR)
	{
		PrepareDecorator(keys.back());
	}
	else if (property.unit == Unit::FILTER)
	{
		PrepareFilter(keys.back());
	}

	if (!result)
	{
		Log::Message(Log::LT_WARNING, "Could not add animation key with property '%s'.", in_property.ToString().c_str());
		keys.pop_back();
	}

	return result;
}